

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSweep.c
# Opt level: O0

int Cec_ManFraClassesUpdate(Cec_ManFra_t *p,Cec_ManSim_t *pSim,Cec_ManPat_t *pPat,Gia_Man_t *pNew)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  Vec_Ptr_t *p_00;
  abctime aVar6;
  Gia_Obj_t *pGVar7;
  Gia_Obj_t *pGVar8;
  bool bVar9;
  abctime clk;
  int iNode;
  int iRepr;
  int k;
  int i;
  Gia_Obj_t *pReprOld;
  Gia_Obj_t *pObjOld;
  Gia_Obj_t *pObj;
  Vec_Ptr_t *vInfo;
  Gia_Man_t *pNew_local;
  Cec_ManPat_t *pPat_local;
  Cec_ManSim_t *pSim_local;
  Cec_ManFra_t *p_local;
  
  aVar5 = Abc_Clock();
  iVar2 = Gia_ManCiNum(p->pAig);
  p_00 = Cec_ManPatCollectPatterns(pPat,iVar2,pSim->nWords);
  aVar6 = Abc_Clock();
  p->timePat = (aVar6 - aVar5) + p->timePat;
  aVar5 = Abc_Clock();
  if (p_00 != (Vec_Ptr_t *)0x0) {
    Gia_ManCreateValueRefs(p->pAig);
    for (iRepr = 0; iRepr < pPat->nSeries; iRepr = iRepr + 1) {
      Cec_ManFraCreateInfo(pSim,pSim->vCiSimInfo,p_00,iRepr);
      iVar2 = Cec_ManSimSimulateRound(pSim,pSim->vCiSimInfo,pSim->vCoSimInfo);
      if (iVar2 != 0) {
        Vec_PtrFree(p_00);
        return 1;
      }
    }
    Vec_PtrFree(p_00);
  }
  aVar6 = Abc_Clock();
  p->timeSim = (aVar6 - aVar5) + p->timeSim;
  iVar2 = Vec_IntSize(p->vXorNodes);
  iVar3 = Gia_ManCoNum(pNew);
  if (iVar2 != iVar3 * 2) {
    __assert_fail("Vec_IntSize(p->vXorNodes) == 2*Gia_ManCoNum(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSweep.c"
                  ,0xd5,
                  "int Cec_ManFraClassesUpdate(Cec_ManFra_t *, Cec_ManSim_t *, Cec_ManPat_t *, Gia_Man_t *)"
                 );
  }
  if (p->pPars->nDepthMax != 1) {
    Gia_ManCleanMark0(p->pAig);
    Gia_ManCleanMark1(p->pAig);
    iNode = 0;
    while( true ) {
      iVar2 = Vec_IntSize(pNew->vCos);
      bVar9 = false;
      if (iNode < iVar2) {
        pObjOld = Gia_ManCo(pNew,iNode);
        bVar9 = pObjOld != (Gia_Obj_t *)0x0;
      }
      if (!bVar9) break;
      Vec_IntEntry(p->vXorNodes,iNode << 1);
      iVar2 = Vec_IntEntry(p->vXorNodes,iNode * 2 + 1);
      if (((*(ulong *)pObjOld >> 0x1e & 1) != 0) ||
         (((uint)((ulong)*(undefined8 *)pObjOld >> 0x3e) & 1) != 1)) {
        pGVar7 = Gia_ManObj(p->pAig,iVar2);
        *(ulong *)pGVar7 = *(ulong *)pGVar7 & 0xffffffffbfffffff | 0x40000000;
      }
      iNode = iNode + 1;
    }
    iNode = 0;
    while( true ) {
      bVar9 = false;
      if (iNode < p->pAig->nObjs) {
        pReprOld = Gia_ManObj(p->pAig,iNode);
        bVar9 = pReprOld != (Gia_Obj_t *)0x0;
      }
      if (!bVar9) break;
      iVar2 = Gia_ObjIsAnd(pReprOld);
      if (iVar2 != 0) {
        pGVar7 = Gia_ObjFanin0(pReprOld);
        uVar1 = *(ulong *)pGVar7;
        pGVar7 = Gia_ObjFanin1(pReprOld);
        *(ulong *)pReprOld =
             *(ulong *)pReprOld & 0xffffffffbfffffff |
             (ulong)((uint)(*(ulong *)pReprOld >> 0x1e) & 1 |
                    (uint)(uVar1 >> 0x1e) & 1 | (uint)(*(ulong *)pGVar7 >> 0x1e) & 1) << 0x1e;
      }
      iNode = iNode + 1;
    }
    iNode = 0;
    while( true ) {
      iVar2 = Vec_IntSize(pNew->vCos);
      bVar9 = false;
      if (iNode < iVar2) {
        pObjOld = Gia_ManCo(pNew,iNode);
        bVar9 = pObjOld != (Gia_Obj_t *)0x0;
      }
      if (!bVar9) break;
      Vec_IntEntry(p->vXorNodes,iNode << 1);
      iVar2 = Vec_IntEntry(p->vXorNodes,iNode * 2 + 1);
      if (((*(ulong *)pObjOld >> 0x1e & 1) != 0) ||
         (((uint)((ulong)*(undefined8 *)pObjOld >> 0x3e) & 1) != 1)) {
        pReprOld = Gia_ManObj(p->pAig,iVar2);
        if (((uint)(*(ulong *)pReprOld >> 0x1e) & 1) != 1) {
          __assert_fail("pObjOld->fMark0 == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSweep.c"
                        ,0xef,
                        "int Cec_ManFraClassesUpdate(Cec_ManFra_t *, Cec_ManSim_t *, Cec_ManPat_t *, Gia_Man_t *)"
                       );
        }
        pGVar7 = Gia_ObjFanin0(pReprOld);
        if (((*(ulong *)pGVar7 >> 0x1e & 1) == 0) &&
           (pGVar7 = Gia_ObjFanin1(pReprOld), (*(ulong *)pGVar7 >> 0x1e & 1) == 0)) {
          *(ulong *)pReprOld = *(ulong *)pReprOld & 0xbfffffffffffffff | 0x4000000000000000;
        }
      }
      iNode = iNode + 1;
    }
    iNode = 0;
    while( true ) {
      bVar9 = false;
      if (iNode < p->pAig->nObjs) {
        pReprOld = Gia_ManObj(p->pAig,iNode);
        bVar9 = pReprOld != (Gia_Obj_t *)0x0;
      }
      if (!bVar9) break;
      iVar2 = Gia_ObjIsAnd(pReprOld);
      if ((iVar2 != 0) && ((*(ulong *)pReprOld >> 0x3e & 1) != 0)) {
        *(ulong *)pReprOld = *(ulong *)pReprOld & 0xffffffffbfffffff;
        *(ulong *)pReprOld = *(ulong *)pReprOld & 0xbfffffffffffffff;
      }
      iNode = iNode + 1;
    }
  }
  p->nAllFailed = 0;
  p->nAllDisproved = 0;
  p->nAllProved = 0;
  iNode = 0;
  do {
    iVar2 = Vec_IntSize(pNew->vCos);
    bVar9 = false;
    if (iNode < iVar2) {
      pObjOld = Gia_ManCo(pNew,iNode);
      bVar9 = pObjOld != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) {
      return 0;
    }
    iVar2 = Vec_IntEntry(p->vXorNodes,iNode << 1);
    iVar3 = Vec_IntEntry(p->vXorNodes,iNode * 2 + 1);
    pGVar7 = Gia_ManObj(p->pAig,iVar2);
    pGVar8 = Gia_ManObj(p->pAig,iVar3);
    if ((*(ulong *)pObjOld >> 0x3e & 1) == 0) {
      if ((*(ulong *)pObjOld >> 0x1e & 1) == 0) {
        if ((*(ulong *)pObjOld >> 0x1e & 1) != 0) {
          __assert_fail("pObj->fMark0 == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSweep.c"
                        ,0x11c,
                        "int Cec_ManFraClassesUpdate(Cec_ManFra_t *, Cec_ManSim_t *, Cec_ManPat_t *, Gia_Man_t *)"
                       );
        }
        if ((*(ulong *)pObjOld >> 0x3e & 1) != 0) {
          __assert_fail("pObj->fMark1 == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSweep.c"
                        ,0x11d,
                        "int Cec_ManFraClassesUpdate(Cec_ManFra_t *, Cec_ManSim_t *, Cec_ManPat_t *, Gia_Man_t *)"
                       );
        }
        iVar2 = Gia_ObjFailed(p->pAig,iVar3);
        if (iVar2 != 0) {
          __assert_fail("!Gia_ObjFailed(p->pAig, iNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSweep.c"
                        ,0x11e,
                        "int Cec_ManFraClassesUpdate(Cec_ManFra_t *, Cec_ManSim_t *, Cec_ManPat_t *, Gia_Man_t *)"
                       );
        }
        iVar2 = Gia_ObjProved(p->pAig,iVar3);
        if (iVar2 != 0) {
          __assert_fail("!Gia_ObjProved(p->pAig, iNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSweep.c"
                        ,0x11f,
                        "int Cec_ManFraClassesUpdate(Cec_ManFra_t *, Cec_ManSim_t *, Cec_ManPat_t *, Gia_Man_t *)"
                       );
        }
        Gia_ObjSetFailed(p->pAig,iVar3);
        p->nAllFailed = p->nAllFailed + 1;
      }
      else {
        if ((*(ulong *)pObjOld >> 0x3e & 1) != 0) {
          __assert_fail("pObj->fMark1 == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSweep.c"
                        ,0x111,
                        "int Cec_ManFraClassesUpdate(Cec_ManFra_t *, Cec_ManSim_t *, Cec_ManPat_t *, Gia_Man_t *)"
                       );
        }
        if (((*(ulong *)pGVar7 >> 0x1e & 1) == 0) && ((*(ulong *)pGVar8 >> 0x1e & 1) == 0)) {
          iVar3 = Gia_ObjRepr(p->pAig,iVar3);
          if (iVar2 == iVar3) {
            Abc_Print(1,"Cec_ManFraClassesUpdate(): Error! Node is not refined!\n");
          }
          p->nAllDisproved = p->nAllDisproved + 1;
        }
      }
    }
    else {
      if ((*(ulong *)pObjOld >> 0x1e & 1) != 0) {
        __assert_fail("pObj->fMark0 == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSweep.c"
                      ,0x105,
                      "int Cec_ManFraClassesUpdate(Cec_ManFra_t *, Cec_ManSim_t *, Cec_ManPat_t *, Gia_Man_t *)"
                     );
      }
      iVar4 = Gia_ObjProved(p->pAig,iVar3);
      if (iVar4 != 0) {
        __assert_fail("!Gia_ObjProved(p->pAig, iNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSweep.c"
                      ,0x106,
                      "int Cec_ManFraClassesUpdate(Cec_ManFra_t *, Cec_ManSim_t *, Cec_ManPat_t *, Gia_Man_t *)"
                     );
      }
      if (((*(ulong *)pGVar7 >> 0x1e & 1) == 0) && ((*(ulong *)pGVar8 >> 0x1e & 1) == 0)) {
        iVar4 = Gia_ObjRepr(p->pAig,iVar3);
        if (iVar2 != iVar4) {
          __assert_fail("iRepr == Gia_ObjRepr(p->pAig, iNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSweep.c"
                        ,0x10a,
                        "int Cec_ManFraClassesUpdate(Cec_ManFra_t *, Cec_ManSim_t *, Cec_ManPat_t *, Gia_Man_t *)"
                       );
        }
        Gia_ObjSetProved(p->pAig,iVar3);
        p->nAllProved = p->nAllProved + 1;
      }
    }
    iNode = iNode + 1;
  } while( true );
}

Assistant:

int Cec_ManFraClassesUpdate( Cec_ManFra_t * p, Cec_ManSim_t * pSim, Cec_ManPat_t * pPat, Gia_Man_t * pNew )
{
    Vec_Ptr_t * vInfo;
    Gia_Obj_t * pObj, * pObjOld, * pReprOld;
    int i, k, iRepr, iNode;
    abctime clk;
clk = Abc_Clock();
    vInfo = Cec_ManPatCollectPatterns( pPat, Gia_ManCiNum(p->pAig), pSim->nWords );
p->timePat += Abc_Clock() - clk;
clk = Abc_Clock();
    if ( vInfo != NULL )
    {
        Gia_ManCreateValueRefs( p->pAig );
        for ( i = 0; i < pPat->nSeries; i++ )
        {
            Cec_ManFraCreateInfo( pSim, pSim->vCiSimInfo, vInfo, i );
            if ( Cec_ManSimSimulateRound( pSim, pSim->vCiSimInfo, pSim->vCoSimInfo ) )
            {
                Vec_PtrFree( vInfo );
                return 1;
            }
        }
        Vec_PtrFree( vInfo );
    }
p->timeSim += Abc_Clock() - clk;
    assert( Vec_IntSize(p->vXorNodes) == 2*Gia_ManCoNum(pNew) );
    // mark the transitive fanout of failed nodes
    if ( p->pPars->nDepthMax != 1 )
    {
        Gia_ManCleanMark0( p->pAig );
        Gia_ManCleanMark1( p->pAig );
        Gia_ManForEachCo( pNew, pObj, k )
        {
            iRepr = Vec_IntEntry( p->vXorNodes, 2*k );
            iNode = Vec_IntEntry( p->vXorNodes, 2*k+1 );
            if ( pObj->fMark0 == 0 && pObj->fMark1 == 1 ) // proved
                continue;
//            Gia_ManObj(p->pAig, iRepr)->fMark0 = 1;
            Gia_ManObj(p->pAig, iNode)->fMark0 = 1;
        }
        // mark the nodes reachable through the failed nodes
        Gia_ManForEachAnd( p->pAig, pObjOld, k )
            pObjOld->fMark0 |= (Gia_ObjFanin0(pObjOld)->fMark0 | Gia_ObjFanin1(pObjOld)->fMark0);
        // unmark the disproved nodes
        Gia_ManForEachCo( pNew, pObj, k )
        {
            iRepr = Vec_IntEntry( p->vXorNodes, 2*k );
            iNode = Vec_IntEntry( p->vXorNodes, 2*k+1 );
            if ( pObj->fMark0 == 0 && pObj->fMark1 == 1 ) // proved
                continue; 
            pObjOld = Gia_ManObj(p->pAig, iNode);
            assert( pObjOld->fMark0 == 1 );
            if ( Gia_ObjFanin0(pObjOld)->fMark0 == 0 && Gia_ObjFanin1(pObjOld)->fMark0 == 0 )
                pObjOld->fMark1 = 1;
        }
        // clean marks
        Gia_ManForEachAnd( p->pAig, pObjOld, k )
            if ( pObjOld->fMark1 )
            {
                pObjOld->fMark0 = 0;
                pObjOld->fMark1 = 0;
            }
    }
    // set the results
    p->nAllProved = p->nAllDisproved = p->nAllFailed = 0;
    Gia_ManForEachCo( pNew, pObj, k )
    {
        iRepr = Vec_IntEntry( p->vXorNodes, 2*k );
        iNode = Vec_IntEntry( p->vXorNodes, 2*k+1 );
        pReprOld = Gia_ManObj(p->pAig, iRepr);
        pObjOld = Gia_ManObj(p->pAig, iNode);
        if ( pObj->fMark1 )
        { // proved
            assert( pObj->fMark0 == 0 );
            assert( !Gia_ObjProved(p->pAig, iNode) );
            if ( pReprOld->fMark0 == 0 && pObjOld->fMark0 == 0 )
//            if ( pObjOld->fMark0 == 0 )
            {
                assert( iRepr == Gia_ObjRepr(p->pAig, iNode) );
                Gia_ObjSetProved( p->pAig, iNode );
                p->nAllProved++;
            }
        }
        else if ( pObj->fMark0 )
        { // disproved
            assert( pObj->fMark1 == 0 );
            if ( pReprOld->fMark0 == 0 && pObjOld->fMark0 == 0 )
//            if ( pObjOld->fMark0 == 0 )
            {
                if ( iRepr == Gia_ObjRepr(p->pAig, iNode) )
                    Abc_Print( 1, "Cec_ManFraClassesUpdate(): Error! Node is not refined!\n" );
                p->nAllDisproved++;
            }
        }
        else
        { // failed
            assert( pObj->fMark0 == 0 );
            assert( pObj->fMark1 == 0 );
            assert( !Gia_ObjFailed(p->pAig, iNode) );
            assert( !Gia_ObjProved(p->pAig, iNode) );
            Gia_ObjSetFailed( p->pAig, iNode );
            p->nAllFailed++;
        }
    } 
    return 0;
}